

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_weakref(HSQUIRRELVM v,SQInteger idx)

{
  SQWeakRef *x;
  SQObjectPtr *in_RDI;
  SQObject *o;
  SQObjectPtr *in_stack_ffffffffffffff98;
  SQVM *in_stack_ffffffffffffffa0;
  SQVM *this;
  undefined1 local_48 [48];
  SQObject *local_18;
  SQObjectPtr *local_8;
  
  local_8 = in_RDI;
  local_18 = &stack_get(in_stack_ffffffffffffffa0,(SQInteger)in_stack_ffffffffffffff98)->
              super_SQObject;
  if ((local_18->_type & 0x8000000) == 0) {
    this = (SQVM *)local_48;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,local_18);
    SQVM::Push(this,local_8);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  }
  else {
    x = SQRefCounted::GetWeakRef
                  ((SQRefCounted *)in_stack_ffffffffffffffa0,
                   (SQObjectType)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)(local_48 + 0x20),x);
    SQVM::Push(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void sq_weakref(HSQUIRRELVM v,SQInteger idx)
{
    SQObject &o=stack_get(v,idx);
    if(ISREFCOUNTED(sq_type(o))) {
        v->Push(_refcounted(o)->GetWeakRef(sq_type(o)));
        return;
    }
    v->Push(o);
}